

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.h
# Opt level: O2

void TTD::SnapShot::
     EmitListHelper<void(*)(TTD::NSSnapValues::SlotArrayInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SlotArrayInfo,2048ul>
               (_func_void_SlotArrayInfo_ptr_FileWriter_ptr_Separator *emitFunc,
               UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *list,
               FileWriter *snapwriter)

{
  SlotArrayInfo *pSVar1;
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *pUVar2;
  Separator SVar3;
  uint32 length;
  SlotArrayInfo *pSVar4;
  SlotArrayInfo *pSVar5;
  
  length = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count(list);
  FileWriter::WriteLengthValue(snapwriter,length,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(snapwriter,CommaAndBigSpaceSeparator);
  (*snapwriter->_vptr_FileWriter[8])(snapwriter,1);
  pSVar5 = (list->m_inlineHeadBlock).CurrPos;
  pSVar1 = (list->m_inlineHeadBlock).BlockData;
  pSVar4 = (SlotArrayInfo *)0x0;
  if (pSVar1 != pSVar5) {
    pSVar4 = pSVar1;
  }
  SVar3 = BigSpaceSeparator;
  do {
    pUVar2 = (UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *)
             (list->m_inlineHeadBlock).Next;
    do {
      do {
        list = pUVar2;
        if (pSVar4 == (SlotArrayInfo *)0x0) {
          (*snapwriter->_vptr_FileWriter[8])(snapwriter,0xffffffffffffffff);
          (*snapwriter->_vptr_FileWriter[5])(snapwriter,2);
          return;
        }
        (*emitFunc)(pSVar4,snapwriter,SVar3);
        pSVar4 = pSVar4 + 1;
        SVar3 = CommaAndBigSpaceSeparator;
        pUVar2 = list;
      } while (pSVar4 != pSVar5);
      pSVar4 = (SlotArrayInfo *)0x0;
      pUVar2 = (UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *)0x0;
    } while (list == (UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *)0x0);
    pSVar5 = (list->m_inlineHeadBlock).CurrPos;
    pSVar4 = (list->m_inlineHeadBlock).BlockData;
  } while( true );
}

Assistant:

static void EmitListHelper(Fn emitFunc, const UnorderedArrayList<T, allocSize>& list, FileWriter* snapwriter)
        {
            snapwriter->WriteLengthValue(list.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
            snapwriter->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
            snapwriter->AdjustIndent(1);
            bool firstElement = true;
            for(auto iter = list.GetIterator(); iter.IsValid(); iter.MoveNext())
            {
                (*emitFunc)(iter.Current(), snapwriter, firstElement ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);
                firstElement = false;
            }
            snapwriter->AdjustIndent(-1);
            snapwriter->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
        }